

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O1

int Gia_ObjFanin0CopyCarry(Vec_Int_t *vCarries,Gia_Obj_t *pObj,int Id)

{
  uint uVar1;
  uint uVar2;
  
  if (vCarries != (Vec_Int_t *)0x0) {
    uVar2 = Id - (*(uint *)pObj & 0x1fffffff);
    if (((int)uVar2 < 0) || (vCarries->nSize <= (int)uVar2)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    uVar2 = vCarries->pArray[uVar2];
    if (uVar2 != 0xffffffff) {
      if ((int)uVar2 < 0) goto LAB_005dc4db;
      uVar1 = *(uint *)pObj >> 0x1d & 1;
      goto LAB_005dc4b8;
    }
  }
  uVar1 = pObj[-(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff)].Value;
  if ((int)uVar1 < 0) {
LAB_005dc4db:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                  ,0xf5,"int Abc_LitNotCond(int, int)");
  }
  uVar2 = (uint)*(undefined8 *)pObj >> 0x1d & 1;
LAB_005dc4b8:
  return uVar2 ^ uVar1;
}

Assistant:

int Gia_ObjFanin0CopyCarry( Vec_Int_t * vCarries, Gia_Obj_t * pObj, int Id )
{
    if ( vCarries == NULL || Vec_IntEntry(vCarries, Gia_ObjFaninId0(pObj, Id)) == -1 )
        return Gia_ObjFanin0Copy(pObj);
    return Abc_LitNotCond( Vec_IntEntry(vCarries, Gia_ObjFaninId0(pObj, Id)), Gia_ObjFaninC0(pObj) );
}